

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<QWindow_*,_QGuiApplicationPrivate::SynthesizedMouseData>_>::
rehash(Data<QHashPrivate::Node<QWindow_*,_QGuiApplicationPrivate::SynthesizedMouseData>_> *this,
      size_t sizeHint)

{
  uchar *puVar1;
  ulong uVar2;
  Span *pSVar3;
  Entry *pEVar4;
  qreal qVar5;
  qreal qVar6;
  qreal qVar7;
  QObject *pQVar8;
  ulong uVar9;
  Node<QWindow_*,_QGuiApplicationPrivate::SynthesizedMouseData> *pNVar10;
  ulong uVar11;
  ulong uVar12;
  size_t index;
  long lVar13;
  size_t numBuckets;
  Span *pSVar14;
  long lVar15;
  R RVar16;
  Bucket BVar17;
  
  if (sizeHint == 0) {
    sizeHint = this->size;
  }
  numBuckets = 0x80;
  if ((0x40 < sizeHint) && (numBuckets = 0xffffffffffffffff, sizeHint >> 0x3e == 0)) {
    lVar13 = 0x3f;
    if (sizeHint != 0) {
      for (; sizeHint >> lVar13 == 0; lVar13 = lVar13 + -1) {
      }
    }
    numBuckets = 1L << (0x41 - ((byte)lVar13 ^ 0x3f) & 0x3f);
  }
  uVar2 = this->numBuckets;
  pSVar3 = this->spans;
  RVar16 = allocateSpans(numBuckets);
  this->spans = (Span *)RVar16.spans;
  this->numBuckets = numBuckets;
  if (0x7f < uVar2) {
    uVar11 = 0;
    pSVar14 = pSVar3;
    do {
      lVar13 = 0;
      do {
        uVar9 = (ulong)pSVar14->offsets[lVar13];
        if (uVar9 != 0xff) {
          pEVar4 = pSVar3[uVar11].entries;
          uVar12 = *(ulong *)pEVar4[uVar9].storage.data;
          uVar12 = (uVar12 >> 0x20 ^ uVar12) * -0x2917014799a6026d;
          uVar12 = (uVar12 >> 0x20 ^ uVar12) * -0x2917014799a6026d;
          BVar17 = Data<QHashPrivate::Node<QWindow*,QGuiApplicationPrivate::SynthesizedMouseData>>::
                   findBucketWithHash<QWindow*>
                             ((Data<QHashPrivate::Node<QWindow*,QGuiApplicationPrivate::SynthesizedMouseData>>
                               *)this,(QWindow **)(pEVar4 + uVar9),
                              uVar12 >> 0x20 ^ this->seed ^ uVar12);
          pNVar10 = Span<QHashPrivate::Node<QWindow_*,_QGuiApplicationPrivate::SynthesizedMouseData>_>
                    ::insert(BVar17.span,BVar17.index);
          pNVar10->key = *(QWindow **)pEVar4[uVar9].storage.data;
          puVar1 = pEVar4[uVar9].storage.data + 8;
          qVar5 = *(qreal *)puVar1;
          qVar6 = *(qreal *)(puVar1 + 8);
          puVar1 = pEVar4[uVar9].storage.data + 0x18;
          qVar7 = *(qreal *)(puVar1 + 8);
          (pNVar10->value).screenPos.xp = *(qreal *)puVar1;
          (pNVar10->value).screenPos.yp = qVar7;
          (pNVar10->value).pos.xp = qVar5;
          (pNVar10->value).pos.yp = qVar6;
          puVar1 = pEVar4[uVar9].storage.data + 0x28;
          pQVar8 = *(QObject **)(puVar1 + 8);
          (pNVar10->value).window.wp.d = *(Data **)puVar1;
          (pNVar10->value).window.wp.value = pQVar8;
          puVar1 = pEVar4[uVar9].storage.data + 0x28;
          puVar1[0] = '\0';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          puVar1[4] = '\0';
          puVar1[5] = '\0';
          puVar1[6] = '\0';
          puVar1[7] = '\0';
          puVar1[8] = '\0';
          puVar1[9] = '\0';
          puVar1[10] = '\0';
          puVar1[0xb] = '\0';
          puVar1[0xc] = '\0';
          puVar1[0xd] = '\0';
          puVar1[0xe] = '\0';
          puVar1[0xf] = '\0';
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 != 0x80);
      Span<QHashPrivate::Node<QWindow_*,_QGuiApplicationPrivate::SynthesizedMouseData>_>::freeData
                (pSVar3 + uVar11);
      uVar11 = uVar11 + 1;
      pSVar14 = pSVar14 + 1;
    } while (uVar11 != uVar2 >> 7);
  }
  if (pSVar3 != (Span *)0x0) {
    lVar13 = *(long *)&pSVar3[-1].allocated;
    if (lVar13 != 0) {
      lVar15 = lVar13 * 0x90;
      do {
        Span<QHashPrivate::Node<QWindow_*,_QGuiApplicationPrivate::SynthesizedMouseData>_>::freeData
                  ((Span<QHashPrivate::Node<QWindow_*,_QGuiApplicationPrivate::SynthesizedMouseData>_>
                    *)(pSVar3[-1].offsets + lVar15));
        lVar15 = lVar15 + -0x90;
      } while (lVar15 != 0);
    }
    operator_delete__(&pSVar3[-1].allocated,lVar13 * 0x90 + 8);
    return;
  }
  return;
}

Assistant:

void rehash(size_t sizeHint = 0)
    {
        if (sizeHint == 0)
            sizeHint = size;
        size_t newBucketCount = GrowthPolicy::bucketsForCapacity(sizeHint);

        Span *oldSpans = spans;
        size_t oldBucketCount = numBuckets;
        spans = allocateSpans(newBucketCount).spans;
        numBuckets = newBucketCount;
        size_t oldNSpans = oldBucketCount >> SpanConstants::SpanShift;

        for (size_t s = 0; s < oldNSpans; ++s) {
            Span &span = oldSpans[s];
            for (size_t index = 0; index < SpanConstants::NEntries; ++index) {
                if (!span.hasNode(index))
                    continue;
                Node &n = span.at(index);
                auto it = findBucket(n.key);
                Q_ASSERT(it.isUnused());
                Node *newNode = it.insert();
                new (newNode) Node(std::move(n));
            }
            span.freeData();
        }
        delete[] oldSpans;
    }